

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  VtabCtx *pVVar1;
  Table *pTVar2;
  char *p;
  Table *pTVar3;
  int iVar4;
  Index *pIVar5;
  char *zFormat;
  uint rc;
  Table *pNew;
  char *zErr;
  Parse local_1d0;
  
  zErr = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pVVar1 = db->pVtabCtx;
  if ((pVVar1 != (VtabCtx *)0x0) && (pVVar1->bDeclared == 0)) {
    pTVar2 = pVVar1->pTab;
    memset(&local_1d0.zErrMsg,0,0x198);
    local_1d0.eParseMode = '\x01';
    local_1d0.nQueryLoop = 1;
    local_1d0.db = db;
    iVar4 = sqlite3RunParser(&local_1d0,zCreateTable,&zErr);
    pTVar3 = local_1d0.pNewTable;
    p = zErr;
    if ((local_1d0.pNewTable == (Table *)0x0 || iVar4 != 0) ||
       (((db->mallocFailed != '\0' || ((local_1d0.pNewTable)->pSelect != (Select *)0x0)) ||
        ((local_1d0.pNewTable)->nModuleArg != 0)))) {
      zFormat = "%s";
      if (zErr == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      rc = 1;
      sqlite3ErrorWithMsg(db,1,zFormat,zErr);
      sqlite3DbFree(db,p);
    }
    else {
      rc = 0;
      if (pTVar2->aCol == (Column *)0x0) {
        pTVar2->aCol = (local_1d0.pNewTable)->aCol;
        pTVar2->nCol = (local_1d0.pNewTable)->nCol;
        pTVar2->tabFlags = pTVar2->tabFlags | (local_1d0.pNewTable)->tabFlags & 0x60;
        (local_1d0.pNewTable)->nCol = 0;
        (local_1d0.pNewTable)->aCol = (Column *)0x0;
        rc = 0;
        if ((((local_1d0.pNewTable)->tabFlags & 0x20) != 0) &&
           (pVVar1->pVTable->pMod->pModule->xUpdate !=
            (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) {
          pIVar5 = sqlite3PrimaryKeyIndex(local_1d0.pNewTable);
          rc = (uint)(pIVar5->nKeyCol != 1);
        }
        pIVar5 = pTVar3->pIndex;
        if (pIVar5 != (Index *)0x0) {
          pTVar2->pIndex = pIVar5;
          pTVar3->pIndex = (Index *)0x0;
          pIVar5->pTable = pTVar2;
        }
      }
      pVVar1->bDeclared = 1;
    }
    local_1d0.eParseMode = '\0';
    if (local_1d0.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_1d0.pVdbe);
    }
    sqlite3DeleteTable(db,local_1d0.pNewTable);
    sqlite3ParserReset(&local_1d0);
    iVar4 = sqlite3ApiExit(db,rc);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar4;
  }
  sqlite3Error(db,0x15);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  iVar4 = sqlite3MisuseError(0x20f90);
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  char *zErr = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  memset(&sParse, 0, sizeof(sParse));
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.db = db;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable, &zErr) 
   && sParse.pNewTable
   && !db->mallocFailed
   && !sParse.pNewTable->pSelect
   && !IsVirtual(sParse.pNewTable)
  ){
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR, (zErr ? "%s" : 0), zErr);
    sqlite3DbFree(db, zErr);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParserReset(&sParse);

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}